

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O1

HT_ErrorCode print_help(int argc,char **argv,int pos)

{
  char *pcVar1;
  long lVar2;
  
  puts("HawkTracer options:");
  lVar2 = 0;
  do {
    pcVar1 = "      ";
    if (*(int *)((long)&arguments[0].is_flag + lVar2) == 0) {
      pcVar1 = "VALUE";
    }
    printf("  %s %s   %s\n",*(undefined8 *)((long)&arguments[0].argument + lVar2),pcVar1,
           *(undefined8 *)((long)&arguments[0].help + lVar2));
    lVar2 = lVar2 + 0x20;
  } while (lVar2 == 0x20);
  exit(0);
}

Assistant:

static HT_ErrorCode
print_help(int argc, char** argv, int pos)
{
    HT_UNUSED(argc);
    HT_UNUSED(argv);
    HT_UNUSED(pos);

    printf("HawkTracer options:\n");

    for (unsigned int x = 0; x < sizeof(arguments) / sizeof(arguments[0]); x++)
    {
        printf("  %s %s   %s\n",
            arguments[x].argument,
            arguments[x].is_flag ? "      " : "VALUE",
            arguments[x].help);
    }

    exit(0);

    return HT_ERR_OK;
}